

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O0

bool __thiscall
google::protobuf::compiler::Parser::Parse(Parser *this,Tokenizer *input,FileDescriptorProto *file)

{
  bool bVar1;
  long in_RDX;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  FileDescriptorProto *unaff_retaddr;
  Parser *in_stack_00000008;
  LocationRecorder root_location;
  SourceCodeInfo source_code_info;
  LogMessage *in_stack_fffffffffffffeb8;
  FileDescriptorProto *in_stack_fffffffffffffec0;
  undefined4 in_stack_fffffffffffffec8;
  undefined1 in_stack_fffffffffffffecc;
  undefined1 in_stack_fffffffffffffecd;
  undefined1 in_stack_fffffffffffffece;
  undefined1 in_stack_fffffffffffffecf;
  Parser *in_stack_fffffffffffffed0;
  Message *in_stack_fffffffffffffed8;
  SourceCodeInfo *in_stack_fffffffffffffee0;
  allocator<char> local_e1;
  string local_e0 [100];
  int local_7c;
  string *in_stack_ffffffffffffff90;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffff98;
  string *in_stack_ffffffffffffffa0;
  Tokenizer *in_stack_ffffffffffffffa8;
  LocationRecorder *in_stack_ffffffffffffffb0;
  Parser *in_stack_ffffffffffffffb8;
  undefined7 in_stack_fffffffffffffff8;
  byte in_stack_ffffffffffffffff;
  
  *in_RDI = in_RSI;
  *(undefined1 *)(in_RDI + 4) = 0;
  std::__cxx11::string::clear();
  SourceCodeInfo::SourceCodeInfo(in_stack_fffffffffffffee0);
  in_RDI[2] = &stack0xffffffffffffffb0;
  bVar1 = LookingAtType((Parser *)in_stack_fffffffffffffec0,
                        (TokenType)((ulong)in_stack_fffffffffffffeb8 >> 0x20));
  if (bVar1) {
    io::Tokenizer::NextWithComments
              (in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
               in_stack_ffffffffffffff90);
  }
  LocationRecorder::LocationRecorder
            ((LocationRecorder *)in_stack_fffffffffffffed0,
             (Parser *)
             CONCAT17(in_stack_fffffffffffffecf,
                      CONCAT16(in_stack_fffffffffffffece,
                               CONCAT15(in_stack_fffffffffffffecd,
                                        CONCAT14(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8
                                                )))));
  LocationRecorder::RecordLegacyLocation
            ((LocationRecorder *)in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,
             (ErrorLocation)((ulong)in_stack_fffffffffffffed0 >> 0x20));
  if (((*(byte *)((long)in_RDI + 0x21) & 1) != 0) ||
     (bVar1 = LookingAt((Parser *)in_stack_fffffffffffffec0,(char *)in_stack_fffffffffffffeb8),
     bVar1)) {
    bVar1 = ParseSyntaxIdentifier(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
    if (!bVar1) {
      in_stack_ffffffffffffffff = 0;
      local_7c = 1;
      goto LAB_00608be9;
    }
    if (in_RDX != 0) {
      FileDescriptorProto::set_syntax(in_stack_fffffffffffffec0,(string *)in_stack_fffffffffffffeb8)
      ;
    }
  }
  else if ((*(byte *)((long)in_RDI + 0x22) & 1) == 0) {
    internal::LogMessage::LogMessage
              ((LogMessage *)in_stack_fffffffffffffed0,
               CONCAT13(in_stack_fffffffffffffecf,
                        CONCAT12(in_stack_fffffffffffffece,
                                 CONCAT11(in_stack_fffffffffffffecd,in_stack_fffffffffffffecc))),
               (char *)in_stack_fffffffffffffec0,(int)((ulong)in_stack_fffffffffffffeb8 >> 0x20));
    internal::LogMessage::operator<<
              ((LogMessage *)in_stack_fffffffffffffec0,(char *)in_stack_fffffffffffffeb8);
    FileDescriptorProto::name_abi_cxx11_((FileDescriptorProto *)0x6089b4);
    internal::LogMessage::operator<<
              ((LogMessage *)in_stack_fffffffffffffec0,(string *)in_stack_fffffffffffffeb8);
    internal::LogMessage::operator<<
              ((LogMessage *)in_stack_fffffffffffffec0,(char *)in_stack_fffffffffffffeb8);
    internal::LogMessage::operator<<
              ((LogMessage *)in_stack_fffffffffffffec0,(char *)in_stack_fffffffffffffeb8);
    in_stack_fffffffffffffed0 =
         (Parser *)
         internal::LogMessage::operator<<
                   ((LogMessage *)in_stack_fffffffffffffec0,(char *)in_stack_fffffffffffffeb8);
    internal::LogFinisher::operator=
              ((LogFinisher *)in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
    internal::LogMessage::~LogMessage((LogMessage *)0x608a3a);
    std::__cxx11::string::operator=((string *)(in_RDI + 5),"proto2");
  }
  if ((*(byte *)((long)in_RDI + 0x22) & 1) == 0) {
    while (in_stack_fffffffffffffecf = AtEnd((Parser *)0x608ab5),
          ((in_stack_fffffffffffffecf ^ 0xff) & 1) != 0) {
      in_stack_fffffffffffffece =
           ParseTopLevelStatement
                     (in_stack_00000008,unaff_retaddr,
                      (LocationRecorder *)
                      CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8));
      if (!(bool)in_stack_fffffffffffffece) {
        SkipStatement((Parser *)in_stack_fffffffffffffec0);
        in_stack_fffffffffffffecd =
             LookingAt((Parser *)in_stack_fffffffffffffec0,(char *)in_stack_fffffffffffffeb8);
        if ((bool)in_stack_fffffffffffffecd) {
          in_stack_fffffffffffffec0 = (FileDescriptorProto *)&local_e1;
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    (local_e0,"Unmatched \"}\".",(allocator *)in_stack_fffffffffffffec0);
          AddError(in_stack_fffffffffffffed0,
                   (string *)
                   CONCAT17(in_stack_fffffffffffffecf,
                            CONCAT16(in_stack_fffffffffffffece,
                                     CONCAT15(in_stack_fffffffffffffecd,
                                              CONCAT14(in_stack_fffffffffffffecc,
                                                       in_stack_fffffffffffffec8)))));
          std::__cxx11::string::~string(local_e0);
          std::allocator<char>::~allocator(&local_e1);
          io::Tokenizer::NextWithComments
                    (in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
                     in_stack_ffffffffffffff90);
        }
      }
    }
    local_7c = 0;
  }
  else {
    in_stack_ffffffffffffffff = (*(byte *)(in_RDI + 4) ^ 0xff) & 1;
    local_7c = 1;
  }
LAB_00608be9:
  LocationRecorder::~LocationRecorder((LocationRecorder *)in_stack_fffffffffffffed0);
  if (local_7c == 0) {
    *in_RDI = 0;
    in_RDI[2] = 0;
    FileDescriptorProto::mutable_source_code_info((FileDescriptorProto *)0x608c24);
    SourceCodeInfo::Swap
              ((SourceCodeInfo *)in_stack_fffffffffffffed0,
               (SourceCodeInfo *)
               CONCAT17(in_stack_fffffffffffffecf,
                        CONCAT16(in_stack_fffffffffffffece,
                                 CONCAT15(in_stack_fffffffffffffecd,
                                          CONCAT14(in_stack_fffffffffffffecc,
                                                   in_stack_fffffffffffffec8)))));
    in_stack_ffffffffffffffff = (*(byte *)(in_RDI + 4) ^ 0xff) & 1;
    local_7c = 1;
  }
  SourceCodeInfo::~SourceCodeInfo((SourceCodeInfo *)in_stack_fffffffffffffec0);
  return (bool)(in_stack_ffffffffffffffff & 1);
}

Assistant:

bool Parser::Parse(io::Tokenizer* input, FileDescriptorProto* file) {
  input_ = input;
  had_errors_ = false;
  syntax_identifier_.clear();

  // Note that |file| could be NULL at this point if
  // stop_after_syntax_identifier_ is true.  So, we conservatively allocate
  // SourceCodeInfo on the stack, then swap it into the FileDescriptorProto
  // later on.
  SourceCodeInfo source_code_info;
  source_code_info_ = &source_code_info;

  if (LookingAtType(io::Tokenizer::TYPE_START)) {
    // Advance to first token.
    input_->NextWithComments(NULL, &upcoming_detached_comments_,
                             &upcoming_doc_comments_);
  }

  {
    LocationRecorder root_location(this);
    root_location.RecordLegacyLocation(file,
                                       DescriptorPool::ErrorCollector::OTHER);

    if (require_syntax_identifier_ || LookingAt("syntax")) {
      if (!ParseSyntaxIdentifier(root_location)) {
        // Don't attempt to parse the file if we didn't recognize the syntax
        // identifier.
        return false;
      }
      // Store the syntax into the file.
      if (file != NULL) file->set_syntax(syntax_identifier_);
    } else if (!stop_after_syntax_identifier_) {
      GOOGLE_LOG(WARNING) << "No syntax specified for the proto file: " << file->name()
                   << ". Please use 'syntax = \"proto2\";' "
                   << "or 'syntax = \"proto3\";' to specify a syntax "
                   << "version. (Defaulted to proto2 syntax.)";
      syntax_identifier_ = "proto2";
    }

    if (stop_after_syntax_identifier_) return !had_errors_;

    // Repeatedly parse statements until we reach the end of the file.
    while (!AtEnd()) {
      if (!ParseTopLevelStatement(file, root_location)) {
        // This statement failed to parse.  Skip it, but keep looping to parse
        // other statements.
        SkipStatement();

        if (LookingAt("}")) {
          AddError("Unmatched \"}\".");
          input_->NextWithComments(NULL, &upcoming_detached_comments_,
                                   &upcoming_doc_comments_);
        }
      }
    }
  }

  input_ = NULL;
  source_code_info_ = NULL;
  assert(file != NULL);
  source_code_info.Swap(file->mutable_source_code_info());
  return !had_errors_;
}